

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O2

void garray_cosinesum(_garray *x,t_symbol *s,int argc,t_atom *argv)

{
  size_t nbytes;
  t_float *vsin;
  uint nsin;
  ulong uVar1;
  t_float tVar2;
  t_float extraout_XMM0_Da;
  t_float dcval;
  
  if (argc < 2) {
    pd_error((void *)0x0,"sinesum: %s: need number of points and partial strengths",
             x->x_realname->s_name);
    return;
  }
  tVar2 = atom_getfloatarg(0,argc,argv);
  nsin = argc - 1;
  nbytes = (ulong)nsin * 4;
  vsin = (t_float *)getbytes(nbytes);
  if (vsin != (t_float *)0x0) {
    dcval = extraout_XMM0_Da;
    for (uVar1 = 0; nsin != uVar1; uVar1 = uVar1 + 1) {
      dcval = atom_getfloatarg((int)uVar1,nsin,argv + 1);
      vsin[uVar1] = dcval;
    }
    garray_dofo(x,(long)tVar2,dcval,nsin,vsin,0);
    freebytes(vsin,nbytes);
    return;
  }
  return;
}

Assistant:

static void garray_cosinesum(t_garray *x, t_symbol *s, int argc, t_atom *argv)
{
    t_float *svec;
    long npoints;
    int i;
    if (argc < 2)
    {
        pd_error(0, "sinesum: %s: need number of points and partial strengths",
            x->x_realname->s_name);
        return;
    }

    npoints = atom_getfloatarg(0, argc, argv);
    argv++, argc--;

    svec = (t_float *)t_getbytes(sizeof(t_float) * argc);
    if (!svec) return;

    for (i = 0; i < argc; i++)
        svec[i] = atom_getfloatarg(i, argc, argv);
    garray_dofo(x, npoints, 0, argc, svec, 0);
    t_freebytes(svec, sizeof(t_float) * argc);
}